

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeparser.cpp
# Opt level: O0

void __thiscall stackjit::ByteCodeParser::nextTokenAtEnd(ByteCodeParser *this)

{
  size_t sVar1;
  size_type sVar2;
  undefined1 local_30 [40];
  ByteCodeParser *this_local;
  
  sVar1 = this->mTokenIndex;
  local_30._32_8_ = this;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->mTokens);
  if (sVar1 == sVar2 - 1) {
    this->mTokenIndex = this->mTokenIndex + 1;
  }
  else {
    nextToken_abi_cxx11_((ByteCodeParser *)local_30);
    std::__cxx11::string::~string((string *)local_30);
  }
  return;
}

Assistant:

void ByteCodeParser::nextTokenAtEnd() {
		if (mTokenIndex != mTokens.size() - 1) {
			nextToken();
		} else {
			mTokenIndex++;
		}
	}